

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highlighting.cpp
# Opt level: O2

vector<duckdb::highlightToken,_true> *
duckdb::GetParseTokens
          (vector<duckdb::highlightToken,_true> *__return_storage_ptr__,char *buf,size_t len)

{
  reference pvVar1;
  InternalException *this;
  const_iterator __position;
  pointer pSVar2;
  allocator local_99;
  highlightToken new_token;
  vector<duckdb::SimplifiedToken,_true> parseTokens;
  string sql;
  string local_48;
  
  sql._M_dataplus._M_p = (pointer)&sql.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&sql,buf,buf + len);
  Parser::Tokenize(&parseTokens,&sql);
  (__return_storage_ptr__->
  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar2 = parseTokens.
           super_vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>.
           super__Vector_base<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>.
           _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pSVar2 == parseTokens.
                  super_vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>.
                  super__Vector_base<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      __position._M_current =
           (__return_storage_ptr__->
           super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_start;
      if (__position._M_current !=
          (__return_storage_ptr__->
          super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pvVar1 = vector<duckdb::highlightToken,_true>::get<true>(__return_storage_ptr__,0);
        __position._M_current =
             (__return_storage_ptr__->
             super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
             _M_impl.super__Vector_impl_data._M_start;
        if (pvVar1->start != 0) {
          local_48._M_dataplus._M_p._0_1_ = 0;
          local_48.field_2._M_local_buf[0] = '\0';
          local_48._M_string_length = 0;
          ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::insert
                    (&__return_storage_ptr__->
                      super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
                     __position,(value_type *)&local_48);
          __position._M_current =
               (__return_storage_ptr__->
               super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
               super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
      }
      if ((__position._M_current ==
           (__return_storage_ptr__->
           super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_finish) && (sql._M_string_length != 0)) {
        local_48._M_dataplus._M_p._0_1_ = 0;
        local_48.field_2._M_local_buf[0] = '\0';
        local_48._M_string_length = 0;
        ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
                  (&__return_storage_ptr__->
                    super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
                   (value_type *)&local_48);
      }
      ::std::_Vector_base<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>::
      ~_Vector_base((_Vector_base<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>
                     *)&parseTokens);
      ::std::__cxx11::string::~string((string *)&sql);
      return __return_storage_ptr__;
    }
    new_token.start = 0;
    new_token.search_match = false;
    if (SIMPLIFIED_TOKEN_COMMENT < pSVar2->type) break;
    new_token.start = pSVar2->start;
    new_token.type = pSVar2->type;
    ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
              (&__return_storage_ptr__->
                super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
               &new_token);
    pSVar2 = pSVar2 + 1;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_48,"Unrecognized token type",&local_99);
  InternalException::InternalException(this,&local_48);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

vector<highlightToken> GetParseTokens(char *buf, size_t len) {
	string sql(buf, len);
	auto parseTokens = duckdb::Parser::Tokenize(sql);

	vector<highlightToken> tokens;
	for (auto &token : parseTokens) {
		highlightToken new_token;
		new_token.type = convertToken(token.type);
		new_token.start = token.start;
		tokens.push_back(new_token);
	}

	if (!tokens.empty() && tokens[0].start > 0) {
		highlightToken new_token;
		new_token.type = tokenType::TOKEN_IDENTIFIER;
		new_token.start = 0;
		tokens.insert(tokens.begin(), new_token);
	}
	if (tokens.empty() && sql.size() > 0) {
		highlightToken new_token;
		new_token.type = tokenType::TOKEN_IDENTIFIER;
		new_token.start = 0;
		tokens.push_back(new_token);
	}
	return tokens;
}